

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nibbler.cpp
# Opt level: O1

bool __thiscall Nibbler::getUnsignedNumber(Nibbler *this,double *result)

{
  ulong uVar1;
  pointer pcVar2;
  ulong uVar3;
  long lVar4;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  float fVar9;
  long *local_40 [2];
  long local_30 [2];
  
  uVar1 = this->_length;
  uVar7 = this->_cursor;
  if (uVar1 <= uVar7) {
    return false;
  }
  pcVar2 = (this->_input)._M_dataplus._M_p;
  if ((int)pcVar2[uVar7] - 0x30U < 10) {
    uVar7 = uVar7 + 1;
    do {
      uVar6 = uVar7;
      uVar8 = uVar1;
      if (uVar1 == uVar6) goto LAB_00108a83;
      uVar7 = uVar6 + 1;
    } while ((int)pcVar2[uVar6] - 0x30U < 10);
    uVar8 = uVar6;
    if ((uVar6 < uVar1) && (uVar3 = uVar7, pcVar2[uVar6] == '.')) {
      while ((uVar8 = uVar7, uVar3 < uVar1 && (uVar8 = uVar3, (int)pcVar2[uVar3] - 0x30U < 10))) {
        uVar7 = uVar1;
        uVar3 = uVar3 + 1;
      }
    }
LAB_00108a83:
    if ((uVar8 < uVar1) && ((byte)(pcVar2[uVar8] | 0x20U) == 0x65)) {
      uVar7 = uVar8 + 1;
      if ((uVar7 < uVar1) && ((pcVar2[uVar7] == '-' || (pcVar2[uVar7] == '+')))) {
        uVar7 = uVar8 + 2;
      }
      if ((uVar1 <= uVar7) || (9 < (int)pcVar2[uVar7] - 0x30U)) goto LAB_00108ae7;
      do {
        uVar8 = uVar1;
        if (uVar1 - 1 == uVar7) break;
        lVar4 = uVar7 + 1;
        uVar8 = uVar7 + 1;
        uVar7 = uVar8;
      } while ((int)pcVar2[lVar4] - 0x30U < 10);
    }
    std::__cxx11::string::substr((ulong)local_40,(ulong)this);
    fVar9 = strtof((char *)local_40[0],(char **)0x0);
    *result = (double)fVar9;
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
    this->_cursor = uVar8;
    bVar5 = true;
  }
  else {
LAB_00108ae7:
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool Nibbler::getUnsignedNumber (double& result)
{
  std::string::size_type i = _cursor;

  // digit+
  if (i < _length && isdigit (_input[i]))
  {
    ++i;

    while (i < _length && isdigit (_input[i]))
      ++i;

    // ( . digit+ )?
    if (i < _length && _input[i] == '.')
    {
      ++i;

      while (i < _length && isdigit (_input[i]))
        ++i;
    }

    // ( [eE] [+-]? digit+ )?
    if (i < _length && (_input[i] == 'e' || _input[i] == 'E'))
    {
      ++i;

      if (i < _length && (_input[i] == '+' || _input[i] == '-'))
        ++i;

      if (i < _length && isdigit (_input[i]))
      {
        ++i;

        while (i < _length && isdigit (_input[i]))
          ++i;

        result = strtof (_input.substr (_cursor, i - _cursor).c_str (), NULL);
        _cursor = i;
        return true;
      }

      return false;
    }

    result = strtof (_input.substr (_cursor, i - _cursor).c_str (), NULL);
    _cursor = i;
    return true;
  }

  return false;
}